

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

void __thiscall
DebugMallocImplementation::~DebugMallocImplementation(DebugMallocImplementation *this)

{
  MallocExtension::~MallocExtension((MallocExtension *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

virtual bool GetNumericProperty(const char* name, size_t* value) {
    if (TestingPortal** portal = TestingPortal::CheckGetPortal(name, value); portal) {
      static DebugTestingPortal* ptr = ([] () {
        static tcmalloc::StaticStorage<DebugTestingPortal> storage;
        return storage.Construct();
      })();
      *portal = ptr;
      *value = 1;
      return true;
    }

    bool result = TCMallocImplementation::GetNumericProperty(name, value);
    if (result && (strcmp(name, "generic.current_allocated_bytes") == 0)) {
      // Subtract bytes kept in the free queue
      size_t qsize = MallocBlock::FreeQueueSize();
      if (*value >= qsize) {
        *value -= qsize;
      }
    }
    return result;
  }